

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircleFilled(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments)

{
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  ImDrawList *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float unaff_retaddr;
  float unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  float a_max;
  int radius_idx;
  ImU32 in_stack_ffffffffffffffcc;
  uint local_1c;
  ImDrawList *pIVar2;
  
  if (((in_EDX & 0xff000000) != 0) && (0.0 < in_XMM0_Da)) {
    pIVar2 = in_RDI;
    if (in_ECX < 1) {
      if ((int)in_XMM0_Da + -1 < 0x40) {
        local_1c = (uint)in_RDI->_Data->CircleSegmentCounts[(int)in_XMM0_Da + -1];
      }
      else {
        fVar1 = acosf((in_XMM0_Da - in_RDI->_Data->CircleSegmentMaxError) / in_XMM0_Da);
        local_1c = ImClamp<int>((int)(6.2831855 / fVar1),0xc,0x200);
      }
    }
    else {
      local_1c = ImClamp<int>(in_ECX,3,0x200);
    }
    if (local_1c == 0xc) {
      PathArcToFast((ImDrawList *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(ImVec2 *)pIVar2,
                    (float)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)in_XMM0_Da);
    }
    else {
      PathArcTo(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                (float)((ulong)pIVar2 >> 0x20),(int)pIVar2);
    }
    PathFillConvex(in_RDI,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void ImDrawList::AddCircleFilled(const ImVec2& center, float radius, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        const int radius_idx = (int)radius - 1;
        if (radius_idx < IM_ARRAYSIZE(_Data->CircleSegmentCounts))
            num_segments = _Data->CircleSegmentCounts[radius_idx]; // Use cached value
        else
            num_segments = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, _Data->CircleSegmentMaxError);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius, 0, 12);
    else
        PathArcTo(center, radius, 0.0f, a_max, num_segments - 1);
    PathFillConvex(col);
}